

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_accelerator_intel
clCreateAcceleratorINTEL
          (cl_context context,cl_accelerator_type_intel accelerator_type,size_t descriptor_size,
          void *descriptor,cl_int *errcode_ret)

{
  bool bVar1;
  CLIntercept *this;
  byte bVar2;
  CLdispatchX *pCVar3;
  cl_accelerator_intel accelerator;
  time_point end;
  cl_motion_estimation_desc_intel *desc;
  allocator local_79;
  time_point local_78;
  cl_context local_70;
  uint64_t local_68;
  cl_int localErrorCode;
  ulong local_58;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
LAB_001311f8:
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_accelerator_intel)0x0;
  }
  local_70 = context;
  pCVar3 = CLIntercept::dispatchX(g_pIntercept,context);
  if (pCVar3->clCreateAcceleratorINTEL ==
      (_func_cl_accelerator_intel_cl_context_cl_accelerator_type_intel_size_t_void_ptr_cl_int_ptr *)
      0x0) goto LAB_001311f8;
  local_68 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar1 = (this->m_Config).CallLogging;
  if (descriptor_size < 0x10 || accelerator_type != 0) {
    if (bVar1 != false) {
      CLIntercept::callLoggingEnter
                (this,"clCreateAcceleratorINTEL",local_68,(cl_kernel)0x0,
                 "context = %p, accelerator_type = %u",local_70,(ulong)accelerator_type);
    }
  }
  else if (bVar1 != false) {
    local_78.__d.__r = (duration)(ulong)*descriptor;
    local_58 = (ulong)*(uint *)((long)descriptor + 4);
    CLIntercept::callLoggingEnter
              (this,"clCreateAcceleratorINTEL",local_68,(cl_kernel)0x0,
               "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]"
               ,local_70,local_78.__d.__r,local_58,(ulong)*(uint *)((long)descriptor + 8),
               (ulong)*(uint *)((long)descriptor + 0xc));
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00131268:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00131268;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_78.__d.__r = (duration)0;
  }
  else {
    local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  accelerator = (*pCVar3->clCreateAcceleratorINTEL)
                          (local_70,accelerator_type,descriptor_size,descriptor,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_68 &&
        (local_68 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_79);
      CLIntercept::updateHostTimingStats(this,"clCreateAcceleratorINTEL",&local_50,local_78,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00131391;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00131391;
    CLIntercept::logError(this,"clCreateAcceleratorINTEL",*errcode_ret);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00131391:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateAcceleratorINTEL",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0
               ,"returned %p",accelerator);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_79);
    CLIntercept::chromeCallLoggingExit
              (this,"clCreateAcceleratorINTEL",&local_50,false,0,local_78,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (accelerator == (cl_accelerator_intel)0x0) {
    return (cl_accelerator_intel)0x0;
  }
  CLIntercept::addAcceleratorInfo(this,accelerator,local_70);
  return accelerator;
}

Assistant:

CL_API_ENTRY cl_accelerator_intel CL_API_CALL clCreateAcceleratorINTEL(
    cl_context context,
    cl_accelerator_type_intel accelerator_type,
    size_t descriptor_size,
    const void* descriptor,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clCreateAcceleratorINTEL )
        {
            GET_ENQUEUE_COUNTER();

            if( ( accelerator_type == CL_ACCELERATOR_TYPE_MOTION_ESTIMATION_INTEL ) &&
                ( descriptor_size >= sizeof( cl_motion_estimation_desc_intel ) ) )
            {
                cl_motion_estimation_desc_intel* desc =
                    (cl_motion_estimation_desc_intel*)descriptor;
                CALL_LOGGING_ENTER( "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]",
                    context,
                    desc->mb_block_type,
                    desc->subpixel_mode,
                    desc->sad_adjust_mode,
                    desc->search_path_type );
            }
            else
            {
                CALL_LOGGING_ENTER( "context = %p, accelerator_type = %u",
                    context,
                    accelerator_type );
            }
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_accelerator_intel retVal = dispatchX.clCreateAcceleratorINTEL(
                context,
                accelerator_type,
                descriptor_size,
                descriptor,
                errcode_ret);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            //ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addAcceleratorInfo(
                    retVal,
                    context );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}